

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::
     Deallocate<4ul,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
               (allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc,
               void *p,size_t n)

{
  if (p != (void *)0x0) {
    operator_delete(alloc,(long)p + 3U & 0xfffffffffffffffc);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x106f,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 4UL, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}